

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall cmRuntimeDependencyArchive::Prepare(cmRuntimeDependencyArchive *this)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmBinUtilsLinker *pcVar4;
  int iVar5;
  string *psVar6;
  cmBinUtilsLinuxELFLinker *this_00;
  char *pcVar7;
  undefined1 uVar8;
  string platform;
  string systemName;
  string local_1e0;
  long *local_1c0;
  char *local_1b8;
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  pcVar2 = this->Command->Makefile;
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_1a0);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_1b8 == (char *)0x0) {
    pcVar2 = this->Command->Makefile;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"CMAKE_HOST_SYSTEM_NAME","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_1e0);
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar3,pcVar3 + psVar6->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    iVar5 = std::__cxx11::string::compare(local_1a0);
    if (iVar5 == 0) {
      pcVar7 = "windows+pe";
LAB_003832e4:
      std::__cxx11::string::_M_replace((ulong)&local_1c0,0,local_1b8,(ulong)pcVar7);
    }
    else {
      iVar5 = std::__cxx11::string::compare(local_1a0);
      if (iVar5 == 0) {
        pcVar7 = "macos+macho";
        goto LAB_003832e4;
      }
      iVar5 = std::__cxx11::string::compare(local_1a0);
      if (iVar5 == 0) {
        pcVar7 = "linux+elf";
        goto LAB_003832e4;
      }
    }
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_1c0);
  if (iVar5 == 0) {
    this_00 = (cmBinUtilsLinuxELFLinker *)operator_new(0x40);
    cmBinUtilsLinuxELFLinker::cmBinUtilsLinuxELFLinker(this_00,this);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_1c0);
    if (iVar5 == 0) {
      this_00 = (cmBinUtilsLinuxELFLinker *)operator_new(0x18);
      cmBinUtilsWindowsPELinker::cmBinUtilsWindowsPELinker
                ((cmBinUtilsWindowsPELinker *)this_00,this);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_1c0);
      if (iVar5 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: ",0x3b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,(char *)local_1c0,(long)local_1b8);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(this->Command,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
        uVar8 = 0;
        goto LAB_0038344e;
      }
      this_00 = (cmBinUtilsLinuxELFLinker *)operator_new(0x18);
      cmBinUtilsMacOSMachOLinker::cmBinUtilsMacOSMachOLinker
                ((cmBinUtilsMacOSMachOLinker *)this_00,this);
    }
  }
  pcVar4 = (this->Linker)._M_t.
           super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
           super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
  (this->Linker)._M_t.
  super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
  super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl = &this_00->super_cmBinUtilsLinker;
  if (pcVar4 != (cmBinUtilsLinker *)0x0) {
    (*pcVar4->_vptr_cmBinUtilsLinker[1])();
  }
  iVar5 = (*((this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl)->_vptr_cmBinUtilsLinker
            [2])();
  uVar8 = (undefined1)iVar5;
LAB_0038344e:
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  return (bool)uVar8;
}

Assistant:

bool cmRuntimeDependencyArchive::Prepare()
{
  std::string platform = this->GetMakefile()->GetSafeDefinition(
    "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM");
  if (platform.empty()) {
    std::string systemName =
      this->GetMakefile()->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (systemName == "Windows") {
      platform = "windows+pe";
    } else if (systemName == "Darwin") {
      platform = "macos+macho";
    } else if (systemName == "Linux") {
      platform = "linux+elf";
    }
  }
  if (platform == "linux+elf") {
    this->Linker = cm::make_unique<cmBinUtilsLinuxELFLinker>(this);
  } else if (platform == "windows+pe") {
    this->Linker = cm::make_unique<cmBinUtilsWindowsPELinker>(this);
  } else if (platform == "macos+macho") {
    this->Linker = cm::make_unique<cmBinUtilsMacOSMachOLinker>(this);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: "
      << platform;
    this->SetError(e.str());
    return false;
  }

  return this->Linker->Prepare();
}